

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_rem_sparc(floatx80 a,floatx80 b,float_status *status)

{
  floatx80 fVar1;
  floatx80 fVar2;
  floatx80 fVar3;
  int iVar4;
  uint32_t bLow;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  byte zSign;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong zSig1;
  ulong uVar19;
  bool bVar20;
  floatx80 a_00;
  floatx80 fVar21;
  
  uVar14 = b.low;
  a_00.low = a.low;
  uVar7 = a._8_8_ & 0xffffffff;
  fVar21._8_8_ = uVar7;
  fVar21.low = a_00.low;
  fVar3._8_8_ = uVar7;
  fVar3.low = a_00.low;
  fVar2._8_8_ = uVar7;
  fVar2.low = a_00.low;
  uVar15 = a.high & 0x7fff;
  if (-1 < (long)a_00.low &&
      ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
LAB_009e3575:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar1._10_6_ = (int6)(uVar7 >> 0x10);
    fVar1.high = 0xffff;
    fVar1.low = 0xc000000000000000;
    return fVar1;
  }
  uVar13 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar14
     ) goto LAB_009e3575;
  uVar6 = (uint)uVar15;
  if (uVar15 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        uVar13 == 0x7fff)) {
LAB_009e35f4:
      a_00._8_8_ = a._8_8_ & 0xffffffff;
      fVar21 = propagateFloatx80NaN_sparc(a_00,b,status);
      return fVar21;
    }
    goto LAB_009e3575;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar14 == 0) goto LAB_009e3575;
    uVar7 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar14 = uVar14 << ((byte)(uVar7 ^ 0x3f) & 0x3f);
    uVar16 = 1 - (int)(uVar7 ^ 0x3f);
  }
  else {
    uVar16 = (uint)uVar13;
    if (uVar13 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
        return fVar21;
      }
      goto LAB_009e35f4;
    }
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      return fVar2;
    }
    if (a_00.low == 0) {
      uVar6 = 0x40;
    }
    else {
      lVar9 = 0x3f;
      if (a_00.low != 0) {
        for (; a_00.low >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      uVar6 = (uint)lVar9 ^ 0x3f;
    }
    a_00.low = a_00.low << ((byte)uVar6 & 0x3f);
    uVar6 = 1 - uVar6;
  }
  uVar6 = uVar6 - uVar16;
  if ((int)uVar6 < 0) {
    if (uVar6 != 0xffffffff) {
      return fVar3;
    }
    uVar7 = a_00.low >> 1;
    zSig1 = a_00.low << 0x3f;
    uVar6 = 0;
  }
  else {
    zSig1 = 0;
    uVar7 = a_00.low;
  }
  uVar17 = uVar14 | 0x8000000000000000;
  a_00.low = 0;
  if (uVar17 <= uVar7) {
    a_00.low = uVar17;
  }
  a_00.low = uVar7 - a_00.low;
  iVar10 = uVar6 - 0x40;
  if (uVar6 < 0x41) {
    uVar7 = (ulong)(uVar17 <= uVar7);
  }
  else {
    uVar19 = uVar17 >> 0x20;
    uVar18 = uVar14 & 0xffffffff00000000 | 0x8000000000000000;
    iVar4 = iVar10;
    do {
      uVar8 = 0xffffffffffffffff;
      if (a_00.low < uVar17) {
        uVar7 = 0xffffffff00000000;
        if (a_00.low < uVar18) {
          uVar7 = a_00.low / uVar19 << 0x20;
        }
        uVar11 = (uVar7 >> 0x20) * (uVar14 & 0xffffffff);
        uVar12 = uVar7 * uVar17;
        uVar8 = zSig1 - uVar12;
        for (lVar9 = ((a_00.low - ((uVar11 >> 0x20) + uVar19 * (uVar7 >> 0x20))) -
                     (ulong)(zSig1 < uVar12)) - (ulong)(uVar12 < uVar11 << 0x20); lVar9 < 0;
            lVar9 = lVar9 + uVar19 + (ulong)bVar20) {
          uVar7 = uVar7 - 0x100000000;
          bVar20 = CARRY8(uVar8,uVar14 << 0x20);
          uVar8 = uVar8 + (uVar14 << 0x20);
        }
        uVar11 = uVar8 >> 0x20 | lVar9 << 0x20;
        uVar8 = 0xffffffff;
        if (uVar11 < uVar18) {
          uVar8 = uVar11 / uVar19;
        }
        uVar8 = uVar8 | uVar7;
      }
      uVar7 = 0;
      if (1 < uVar8) {
        uVar7 = uVar8 - 2;
      }
      lVar9 = (uVar7 & 0xffffffff) * uVar19 + (uVar7 >> 0x20) * (uVar14 & 0xffffffff);
      uVar8 = uVar7 * uVar17;
      a_00.low = (ulong)((((int)a_00.low - (uint)(zSig1 < uVar8)) -
                         ((int)((ulong)lVar9 >> 0x20) + (int)(uVar7 >> 0x20) * (int)(uVar17 >> 0x20)
                         )) - (uint)(uVar8 < (ulong)(lVar9 << 0x20))) << 0x3e | zSig1 + -uVar8 >> 2;
      zSig1 = -uVar8 << 0x3e;
      iVar10 = iVar4 + -0x3e;
      bVar20 = 0x3e < iVar4;
      iVar4 = iVar10;
    } while (bVar20);
  }
  zSign = (byte)((a._8_4_ & 0xffff) >> 0xf);
  if (iVar10 < -0x3f) {
    uVar14 = 0;
  }
  else {
    uVar18 = 0xffffffffffffffff;
    if (a_00.low < uVar17) {
      uVar19 = uVar17 >> 0x20;
      uVar8 = uVar14 & 0xffffffff00000000 | 0x8000000000000000;
      uVar7 = 0xffffffff00000000;
      if (a_00.low < uVar8) {
        uVar7 = a_00.low / uVar19 << 0x20;
      }
      uVar11 = (uVar14 & 0xffffffff) * (uVar7 >> 0x20);
      uVar12 = uVar7 * uVar17;
      uVar18 = zSig1 - uVar12;
      lVar9 = ((a_00.low - ((uVar11 >> 0x20) + (uVar7 >> 0x20) * uVar19)) - (ulong)(zSig1 < uVar12))
              - (ulong)(uVar12 < uVar11 << 0x20);
      if (lVar9 < 0) {
        do {
          uVar7 = uVar7 - 0x100000000;
          bVar20 = CARRY8(uVar18,uVar14 << 0x20);
          uVar18 = uVar18 + (uVar14 << 0x20);
          lVar9 = lVar9 + uVar19 + (ulong)bVar20;
        } while (lVar9 < 0);
      }
      uVar11 = uVar18 >> 0x20 | lVar9 << 0x20;
      uVar18 = 0xffffffff;
      if (uVar11 < uVar8) {
        uVar18 = uVar11 / uVar19;
      }
      uVar18 = uVar18 | uVar7;
    }
    uVar19 = 0;
    uVar7 = uVar18 - 2;
    if (uVar18 < 2) {
      uVar7 = uVar19;
    }
    bVar5 = -(byte)iVar10;
    uVar7 = uVar7 >> (bVar5 & 0x3f);
    uVar18 = uVar7 << (bVar5 & 0x3f);
    uVar12 = (uVar14 & 0xffffffff) * (uVar18 >> 0x20);
    uVar8 = (uVar18 & 0xffffffff) * (uVar17 >> 0x20);
    uVar11 = uVar8 + uVar12;
    uVar14 = 0xffffffff00000000;
    if (!CARRY8(uVar8,uVar12)) {
      uVar14 = uVar19;
    }
    uVar8 = uVar18 * uVar17;
    bVar20 = zSig1 < uVar8;
    zSig1 = zSig1 - uVar8;
    a_00.low = (((a_00.low - bVar20) - ((uVar11 >> 0x20) + (uVar18 >> 0x20) * (uVar17 >> 0x20))) +
               uVar14) - (ulong)(uVar8 < uVar11 << 0x20);
    uVar14 = uVar17 << (bVar5 & 0x3f);
    uVar17 = uVar17 >> ((byte)iVar10 & 0x3f);
    if (iVar10 == 0) {
      uVar17 = uVar19;
    }
    if ((uVar17 < a_00.low) || (uVar17 == a_00.low && uVar14 <= zSig1)) {
      do {
        do {
          uVar7 = uVar7 + 1;
          uVar6 = (uint)uVar7;
          uVar18 = zSig1 - uVar14;
          bVar20 = zSig1 < uVar14;
          zSig1 = zSig1 - uVar14;
          a_00.low = (a_00.low - uVar17) - (ulong)bVar20;
        } while (uVar17 < a_00.low);
      } while (uVar17 == a_00.low && uVar14 <= uVar18);
      goto LAB_009e3931;
    }
  }
  uVar6 = (uint)uVar7;
LAB_009e3931:
  uVar7 = uVar14 - zSig1;
  uVar14 = (uVar17 - a_00.low) - (ulong)(uVar14 < zSig1);
  if (((uVar14 < a_00.low) || (uVar7 < zSig1 && uVar14 == a_00.low)) ||
     ((uVar7 == zSig1 && ((uVar14 == a_00.low && ((uVar6 & 1) != 0)))))) {
    zSign = zSign ^ 1;
    zSig1 = uVar7;
    a_00.low = uVar14;
  }
  fVar21 = normalizeRoundAndPackFloatx80_sparc
                     ('P',zSign,uVar16 + iVar10 + 0x40,a_00.low,zSig1,status);
  return fVar21;
}

Assistant:

floatx80 floatx80_rem(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t q, term0, term1, alternateASig0, alternateASig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig0<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( (uint64_t) ( aSig0<<1 ) == 0 ) return a;
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        shift128Right( aSig0, 0, 1, &aSig0, &aSig1 );
        expDiff = 0;
    }
    q = ( bSig <= aSig0 );
    if ( q ) aSig0 -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        mul64To128( bSig, q, &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( aSig0, aSig1, 62, &aSig0, &aSig1 );
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        mul64To128( bSig, q<<( 64 - expDiff ), &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( 0, bSig, 64 - expDiff, &term0, &term1 );
        while ( le128( term0, term1, aSig0, aSig1 ) ) {
            ++q;
            sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        }
    }
    else {
        term1 = 0;
        term0 = bSig;
    }
    sub128( term0, term1, aSig0, aSig1, &alternateASig0, &alternateASig1 );
    if (    lt128( alternateASig0, alternateASig1, aSig0, aSig1 )
         || (    eq128( alternateASig0, alternateASig1, aSig0, aSig1 )
              && ( q & 1 ) )
       ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
        zSign = ! zSign;
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);

}